

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O2

rt_expression_interface<double> * __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::substitute
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this,
          vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
          *e,vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
             *repl)

{
  pointer pprVar1;
  rt_expression_interface<double> *prVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  rt_expression_interface<double> *prVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar7;
  
  uVar7 = 0;
  while( true ) {
    pprVar1 = (e->
              super__Vector_base<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(e->
                      super__Vector_base<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pprVar1 >> 3) <= uVar7) {
      prVar6 = (rt_expression_interface<double> *)operator_new(0x20);
      prVar2 = (this->lhs_)._M_ptr;
      iVar3 = (*prVar2->_vptr_rt_expression_interface[0xf])(prVar2,e,repl);
      iVar4 = (*((this->op_)._M_ptr)->_vptr_op_interface[2])();
      prVar2 = (this->rhs_)._M_ptr;
      iVar5 = (*prVar2->_vptr_rt_expression_interface[0xf])(prVar2,e,repl);
      prVar6->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_binary_expr_001117b8;
      prVar6[1]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var,iVar3);
      prVar6[2]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_00,iVar4);
      prVar6[3]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_01,iVar5);
      return prVar6;
    }
    iVar3 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])
                      (this,pprVar1[uVar7]);
    if ((char)iVar3 != '\0') break;
    uVar7 = uVar7 + 1;
  }
  iVar3 = (*(repl->
            super__Vector_base<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
            )._M_impl.super__Vector_impl_data._M_start[uVar7]->_vptr_rt_expression_interface[2])();
  return (rt_expression_interface<double> *)CONCAT44(extraout_var_02,iVar3);
}

Assistant:

InterfaceType * substitute(std::vector<const InterfaceType *> const &  e,
                                 std::vector<const InterfaceType *> const &  repl) const
      {
        for (size_t i=0; i<e.size(); ++i)
          if (deep_equal(e[i]))
            return repl[i]->clone();

        return new rt_binary_expr(lhs_->substitute(e, repl),
                               op_->clone(),
                               rhs_->substitute(e, repl) );
      }